

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O3

void __thiscall OpenMD::Molecule::addRigidBody(Molecule *this,RigidBody *rb)

{
  pointer *pppRVar1;
  iterator __position;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  _Var2;
  RigidBody *local_10;
  
  local_10 = rb;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::RigidBody**,std::vector<OpenMD::RigidBody*,std::allocator<OpenMD::RigidBody*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::RigidBody*const>>
                    ((this->rigidBodies_).
                     super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->rigidBodies_).
                     super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->rigidBodies_).
       super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (_Var2._M_current ==
        (this->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<OpenMD::RigidBody*,std::allocator<OpenMD::RigidBody*>>::
      _M_realloc_insert<OpenMD::RigidBody*const&>
                ((vector<OpenMD::RigidBody*,std::allocator<OpenMD::RigidBody*>> *)
                 &this->rigidBodies_,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppRVar1 = &(this->rigidBodies_).
                  super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppRVar1 = *pppRVar1 + 1;
    }
  }
  return;
}

Assistant:

void Molecule::addRigidBody(RigidBody* rb) {
    if (std::find(rigidBodies_.begin(), rigidBodies_.end(), rb) ==
        rigidBodies_.end()) {
      rigidBodies_.push_back(rb);
    }
  }